

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  sqlite3 *db_00;
  char *z;
  bool local_69;
  sqlite3 *db;
  char *zRet;
  uchar *puStack_50;
  int len;
  uchar *zCsr;
  Token tname;
  int token;
  uchar *zTableName;
  uchar *zSql;
  sqlite3_value **argv_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  puVar2 = sqlite3_value_text(*argv);
  puVar3 = sqlite3_value_text(argv[1]);
  zRet._4_4_ = 0;
  db_00 = sqlite3_context_db_handle(context);
  puStack_50 = puVar2;
  if (puVar2 != (uchar *)0x0) {
    do {
      puVar1 = puStack_50;
      if (*puStack_50 == '\0') {
        return;
      }
      tname.z._0_4_ = zRet._4_4_;
      do {
        puStack_50 = puStack_50 + (int)zRet._4_4_;
        zRet._4_4_ = sqlite3GetToken(puStack_50,(int *)&tname.field_0xc);
      } while (tname._12_4_ == 0xa3);
      local_69 = tname._12_4_ != 0x16 && tname._12_4_ != 0x7d;
    } while (local_69);
    z = sqlite3MPrintf(db_00,"%.*s\"%w\"%s",(ulong)(uint)((int)puVar1 - (int)puVar2),puVar2,puVar3,
                       puVar1 + (uint)tname.z);
    sqlite3_result_text(context,z,-1,sqlite3MallocSize);
  }
  return;
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  unsigned char const *zSql = sqlite3_value_text(argv[0]);
  unsigned char const *zTableName = sqlite3_value_text(argv[1]);

  int token;
  Token tname;
  unsigned char const *zCsr = zSql;
  int len = 0;
  char *zRet;

  sqlite3 *db = sqlite3_context_db_handle(context);

  UNUSED_PARAMETER(NotUsed);

  /* The principle used to locate the table name in the CREATE TABLE 
  ** statement is that the table name is the first non-space token that
  ** is immediately followed by a TK_LP or TK_USING token.
  */
  if( zSql ){
    do {
      if( !*zCsr ){
        /* Ran out of input before finding an opening bracket. Return NULL. */
        return;
      }

      /* Store the token that zCsr points to in tname. */
      tname.z = (char*)zCsr;
      tname.n = len;

      /* Advance zCsr to the next token. Store that token type in 'token',
      ** and its length in 'len' (to be used next iteration of this loop).
      */
      do {
        zCsr += len;
        len = sqlite3GetToken(zCsr, &token);
      } while( token==TK_SPACE );
      assert( len>0 );
    } while( token!=TK_LP && token!=TK_USING );

    zRet = sqlite3MPrintf(db, "%.*s\"%w\"%s", (int)(((u8*)tname.z) - zSql),
       zSql, zTableName, tname.z+tname.n);
    sqlite3_result_text(context, zRet, -1, SQLITE_DYNAMIC);
  }
}